

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPartHelper.cpp
# Opt level: O2

void (anonymous_namespace)::
     print<__gnu_cxx::__normal_iterator<Imf_3_2::MultiViewChannelName*,std::vector<Imf_3_2::MultiViewChannelName,std::allocator<Imf_3_2::MultiViewChannelName>>>>
               (__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                *begin,__normal_iterator<Imf_3_2::MultiViewChannelName_*,_std::vector<Imf_3_2::MultiViewChannelName,_std::allocator<Imf_3_2::MultiViewChannelName>_>_>
                       *end)

{
  ostream *poVar1;
  MultiViewChannelName *pMVar2;
  MultiViewChannelName *pMVar3;
  int iVar4;
  int iVar5;
  string *psVar6;
  
  pMVar2 = end->_M_current;
  iVar5 = 1;
  for (pMVar3 = begin->_M_current; pMVar3 != pMVar2; pMVar3 = pMVar3 + 1) {
    if (iVar5 < pMVar3->part_number) {
      iVar5 = pMVar3->part_number;
    }
  }
  iVar4 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar4 != iVar5; iVar4 = iVar4 + 1) {
    for (psVar6 = (string *)&begin->_M_current->internal_name;
        (MultiViewChannelName *)(psVar6 + -0x48) != pMVar2; psVar6 = psVar6 + 0x68) {
      if (*(int *)(psVar6 + -8) == iVar4) {
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = std::operator<<(poVar1,psVar6 + -0x48);
        poVar1 = std::operator<<(poVar1," in ");
        poVar1 = std::operator<<(poVar1,psVar6 + -0x28);
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = std::operator<<(poVar1,psVar6);
        std::operator<<(poVar1,"\n");
        pMVar2 = end->_M_current;
      }
    }
  }
  return;
}

Assistant:

void
print (const T& begin, const T& end)
{
    int parts = 1;
    for (T i = begin; i != end; i++)
    {
        parts = max (i->part_number, parts);
    }

    for (int p = 0; p < parts; p++)
    {
        for (T i = begin; i != end; i++)
        {
            if (i->part_number == p)
            {
                cout << i->part_number << ' ' << i->name << " in " << i->view
                     << ' ' << ' ' << i->internal_name << "\n";
            }
        }
    }
}